

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::OpenPopupOnItemClick(char *str_id,ImGuiPopupFlags popup_flags)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID local_2c;
  ImGuiID id;
  int mouse_button;
  ImGuiWindow *window;
  ImGuiPopupFlags popup_flags_local;
  char *str_id_local;
  
  this = GImGui->CurrentWindow;
  bVar1 = IsMouseReleased(popup_flags & 0x1f);
  if ((bVar1) && (bVar1 = IsItemHovered(8), bVar1)) {
    if (str_id == (char *)0x0) {
      local_2c = (this->DC).LastItemId;
    }
    else {
      local_2c = ImGuiWindow::GetID(this,str_id,(char *)0x0);
    }
    if (local_2c == 0) {
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x20c1,"void ImGui::OpenPopupOnItemClick(const char *, ImGuiPopupFlags)");
    }
    OpenPopupEx(local_2c,popup_flags);
  }
  return;
}

Assistant:

void ImGui::OpenPopupOnItemClick(const char* str_id, ImGuiPopupFlags popup_flags)
{
    ImGuiWindow* window = GImGui->CurrentWindow;
    int mouse_button = (popup_flags & ImGuiPopupFlags_MouseButtonMask_);
    if (IsMouseReleased(mouse_button) && IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup))
    {
        ImGuiID id = str_id ? window->GetID(str_id) : window->DC.LastItemId; // If user hasn't passed an ID, we can use the LastItemID. Using LastItemID as a Popup ID won't conflict!
        IM_ASSERT(id != 0);                                                  // You cannot pass a NULL str_id if the last item has no identifier (e.g. a Text() item)
        OpenPopupEx(id, popup_flags);
    }
}